

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O0

void __thiscall
FPlayerNameBox::FPlayerNameBox
          (FPlayerNameBox *this,int x,int y,int height,int frameofs,char *text,FFont *font,
          EColorRange color,FName *action)

{
  FName local_2c;
  char *local_28;
  char *text_local;
  int frameofs_local;
  int height_local;
  int y_local;
  int x_local;
  FPlayerNameBox *this_local;
  
  local_28 = text;
  text_local._0_4_ = frameofs;
  text_local._4_4_ = height;
  frameofs_local = y;
  height_local = x;
  _y_local = this;
  FName::FName(&local_2c,action);
  FListMenuItemSelectable::FListMenuItemSelectable
            (&this->super_FListMenuItemSelectable,x,y,height,&local_2c,-1);
  (this->super_FListMenuItemSelectable).super_FListMenuItem._vptr_FListMenuItem =
       (_func_int **)&PTR__FPlayerNameBox_00b640c8;
  FString::FString(&this->mText);
  FString::operator=(&this->mText,local_28);
  this->mFont = font;
  this->mFontColor = color;
  this->mFrameSize = (int)text_local;
  this->mPlayerName[0] = '\0';
  this->mEntering = false;
  return;
}

Assistant:

FPlayerNameBox::FPlayerNameBox(int x, int y, int height, int frameofs, const char *text, FFont *font, EColorRange color, FName action)
: FListMenuItemSelectable(x, y, height, action)
{
	mText = text;
	mFont = font;
	mFontColor = color;
	mFrameSize = frameofs;
	mPlayerName[0] = 0;
	mEntering = false;
}